

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::detail::MultipartFormDataParser::MultipartFormDataParser(MultipartFormDataParser *this)

{
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::string::string((string *)this,"--",&local_21);
  std::__cxx11::string::string((string *)&this->crlf_,"\r\n",&local_22);
  std::__cxx11::string::string((string *)&this->dash_crlf_,"--\r\n",&local_23);
  (this->boundary_)._M_dataplus._M_p = (pointer)&(this->boundary_).field_2;
  (this->boundary_)._M_string_length = 0;
  (this->boundary_).field_2._M_local_buf[0] = '\0';
  (this->dash_boundary_crlf_)._M_dataplus._M_p = (pointer)&(this->dash_boundary_crlf_).field_2;
  (this->dash_boundary_crlf_)._M_string_length = 0;
  (this->dash_boundary_crlf_).field_2._M_local_buf[0] = '\0';
  (this->crlf_dash_boundary_)._M_dataplus._M_p = (pointer)&(this->crlf_dash_boundary_).field_2;
  (this->crlf_dash_boundary_)._M_string_length = 0;
  (this->crlf_dash_boundary_).field_2._M_local_buf[0] = '\0';
  this->state_ = 0;
  this->is_valid_ = false;
  MultipartFormData::MultipartFormData(&this->file_);
  (this->buf_)._M_dataplus._M_p = (pointer)&(this->buf_).field_2;
  (this->buf_)._M_string_length = 0;
  (this->buf_).field_2._M_local_buf[0] = '\0';
  this->buf_spos_ = 0;
  this->buf_epos_ = 0;
  return;
}

Assistant:

MultipartFormDataParser() = default;